

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     handle_int_type_spec<fmt::v5::internal::int_type_checker<fmt::v5::internal::error_handler>>
               (char spec,int_type_checker<fmt::v5::internal::error_handler> *handler)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  uVar2 = iVar1 - 0x42;
  if (((0x36 < uVar2) || ((0x40300500400001U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) && (iVar1 != 0)) {
    int_type_checker<fmt::v5::internal::error_handler>::on_error(handler);
    return;
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'd':
    handler.on_dec();
    break;
  case 'x': case 'X':
    handler.on_hex();
    break;
  case 'b': case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}